

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPreviewImageAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::PreviewImage>::readValueFrom
          (TypedAttribute<Imf_3_4::PreviewImage> *this,IStream *is,int size,int version)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  InputExc *pIVar4;
  IStream *in;
  int in_EDX;
  int i;
  PreviewRgba *pixels;
  int numPixels;
  PreviewImage p;
  int height;
  int width;
  int *in_stack_ffffffffffffff68;
  IStream *in_stack_ffffffffffffff70;
  int local_54;
  PreviewRgba *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  PreviewImage *in_stack_ffffffffffffffc0;
  int local_20;
  int local_1c;
  
  Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68)
  ;
  Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68)
  ;
  if ((-1 < local_1c) && (-1 < local_20)) {
    if ((long)local_1c * (long)local_20 * 4 + 8 != (long)in_EDX) {
      pIVar4 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::InputExc::InputExc
                (pIVar4,"Mismatch between Preview Image Attribute size and dimensions");
      __cxa_throw(pIVar4,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
    }
    PreviewImage::PreviewImage
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
    uVar1 = PreviewImage::width((PreviewImage *)&stack0xffffffffffffffc0);
    uVar2 = PreviewImage::height((PreviewImage *)&stack0xffffffffffffffc0);
    iVar3 = uVar1 * uVar2;
    in = (IStream *)PreviewImage::pixels((PreviewImage *)&stack0xffffffffffffffc0);
    for (local_54 = 0; local_54 < iVar3; local_54 = local_54 + 1) {
      Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(in,(uchar *)in_stack_ffffffffffffff68);
      Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(in,(uchar *)in_stack_ffffffffffffff68);
      Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(in,(uchar *)in_stack_ffffffffffffff68);
      Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(in,(uchar *)in_stack_ffffffffffffff68);
    }
    PreviewImage::operator=
              (in_stack_ffffffffffffffc0,(PreviewImage *)CONCAT44(iVar3,in_stack_ffffffffffffffb8));
    PreviewImage::~PreviewImage((PreviewImage *)in);
    return;
  }
  pIVar4 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::InputExc::InputExc(pIVar4,"Invalid dimensions in Preview Image Attribute");
  __cxa_throw(pIVar4,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

IMF_EXPORT void
PreviewImageAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    int width, height;

    Xdr::read<StreamIO> (is, width);
    Xdr::read<StreamIO> (is, height);

    if (width < 0 || height < 0)
    {
        throw IEX_NAMESPACE::InputExc (
            "Invalid dimensions in Preview Image Attribute");
    }

    // total attribute size should be four bytes per pixel + 8 bytes for width and height dimensions
    if (static_cast<uint64_t> (width) * static_cast<uint64_t> (height) * 4l +
            8l !=
        static_cast<uint64_t> (size))
    {
        throw IEX_NAMESPACE::InputExc (
            "Mismatch between Preview Image Attribute size and dimensions");
    }

    PreviewImage p (width, height);

    int          numPixels = p.width () * p.height ();
    PreviewRgba* pixels    = p.pixels ();

    for (int i = 0; i < numPixels; ++i)
    {
        Xdr::read<StreamIO> (is, pixels[i].r);
        Xdr::read<StreamIO> (is, pixels[i].g);
        Xdr::read<StreamIO> (is, pixels[i].b);
        Xdr::read<StreamIO> (is, pixels[i].a);
    }

    _value = p;
}